

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_CheckValue::test_method(util_CheckValue *this)

{
  long in_FS_OFFSET;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  SettingsValue in_stack_fffffffffffff918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_680;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_668;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_650;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  allocator_type local_5fa;
  allocator<char> local_5f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  allocator<char> local_5d9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_598;
  UniValue local_578;
  UniValue local_520;
  UniValue local_4c8;
  UniValue local_470;
  UniValue local_418;
  UniValue local_3c0;
  UniValue local_368;
  UniValue local_310;
  UniValue local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  UniValue local_240;
  UniValue local_1e8;
  UniValue local_190;
  UniValue local_138;
  undefined1 local_e0 [168];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.val._M_dataplus._M_p = (pointer)&local_138.val.field_2;
  local_138.val._M_string_length = 0;
  local_138.val.field_2._M_local_buf[0] = '\0';
  local_138.typ = VNULL;
  local_138.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0[0x58] = true;
  local_e0[0x59] = true;
  local_e0[0x5a] = true;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_598.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_598);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,(char *)0x0,(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_598);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_138);
  local_260._M_dataplus._M_p._0_1_ = 0;
  UniValue::UniValue<bool,_bool,_true>(&local_190,(bool *)&local_260);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5b8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b8);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_190);
  local_260._M_dataplus._M_p._0_1_ = 0;
  UniValue::UniValue<bool,_bool,_true>(&local_1e8,(bool *)&local_260);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5d8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5d8);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_1e8);
  local_5d9 = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(&local_240,(bool *)&local_5d9);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"1",&local_5f9);
  __l._M_len = 1;
  __l._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5f8,__l,&local_5fa);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_5f8);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=0",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f8);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_240);
  local_260._M_dataplus._M_p._0_1_ = 0;
  UniValue::UniValue<bool,_bool,_true>(&local_2b8,(bool *)&local_260);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_618);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=1",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_618);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_2b8);
  local_260._M_dataplus._M_p._0_1_ = 0;
  UniValue::UniValue<bool,_bool,_true>(&local_310,(bool *)&local_260);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_638);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=2",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_310);
  local_5d9 = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(&local_368,(bool *)&local_5d9);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"1",&local_5f9);
  __l_00._M_len = 1;
  __l_00._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_650,__l_00,&local_5fa);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_650);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-novalue=abc",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_650);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_368);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_3c0,(char (*) [1])0xc694e1);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_5d9);
  __l_01._M_len = 1;
  __l_01._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_668,__l_01,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_668);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_668);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_3c0);
  UniValue::UniValue<const_char_(&)[1],_char[1],_true>(&local_418,(char (*) [1])0xc694e1);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"",&local_5d9);
  __l_02._M_len = 1;
  __l_02._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_680,__l_02,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),&local_680);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_680);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_418);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_470,(char (*) [2])0xcbbcad);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "0";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"0",&local_5d9);
  __l_03._M_len = 1;
  __l_03._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffff968,__l_03,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff968);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=0",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff968);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_470);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_4c8,(char (*) [2])0xc69f21);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "1";
  local_e0._104_8_ = 1;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"1",&local_5d9);
  __l_04._M_len = 1;
  __l_04._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffff950,__l_04,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff950);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=1",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff950);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_4c8);
  UniValue::UniValue<const_char_(&)[2],_char[2],_true>(&local_520,(char (*) [2])0xb6523c);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "2";
  local_e0._104_8_ = 2;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x1;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"2",&local_5d9);
  __l_05._M_len = 1;
  __l_05._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffff938,__l_05,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff938);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=2",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff938);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_520);
  UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_578,(char (*) [4])0xc6d700);
  CheckValueTest::Expect::Expect((Expect *)local_e0,in_stack_fffffffffffff918);
  local_e0._96_8_ = "abc";
  local_e0._104_8_ = 0;
  local_e0[0x70] = true;
  local_e0[0x78] = (_Storage<bool,_true>)0x0;
  local_e0[0x79] = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"abc",&local_5d9);
  __l_06._M_len = 1;
  __l_06._M_array = &local_260;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffff920,__l_06,(allocator_type *)&local_5f9);
  std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>::operator=
            ((optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>> *)
             (local_e0 + 0x80),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xfffffffffffff920);
  CheckValueTest::CheckValue(&this->super_CheckValueTest,1,"-value=abc",(Expect *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffff920);
  std::__cxx11::string::~string((string *)&local_260);
  CheckValueTest::Expect::~Expect((Expect *)local_e0);
  UniValue::~UniValue(&local_578);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_CheckValue, CheckValueTest)
{
    using M = ArgsManager;

    CheckValue(M::ALLOW_ANY, nullptr, Expect{{}}.DefaultString().DefaultInt().DefaultBool().List({}));
    CheckValue(M::ALLOW_ANY, "-novalue", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=0", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-novalue=1", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=2", Expect{false}.String("0").Int(0).Bool(false).List({}));
    CheckValue(M::ALLOW_ANY, "-novalue=abc", Expect{true}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=", Expect{""}.String("").Int(0).Bool(true).List({""}));
    CheckValue(M::ALLOW_ANY, "-value=0", Expect{"0"}.String("0").Int(0).Bool(false).List({"0"}));
    CheckValue(M::ALLOW_ANY, "-value=1", Expect{"1"}.String("1").Int(1).Bool(true).List({"1"}));
    CheckValue(M::ALLOW_ANY, "-value=2", Expect{"2"}.String("2").Int(2).Bool(true).List({"2"}));
    CheckValue(M::ALLOW_ANY, "-value=abc", Expect{"abc"}.String("abc").Int(0).Bool(false).List({"abc"}));
}